

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

int __thiscall
UnifiedRegex::ChompSetGroupInst<(UnifiedRegex::ChompMode)1>::Print
          (ChompSetGroupInst<(UnifiedRegex::ChompMode)1> *this,DebugWriter *w,Label label,
          Char *litbuf)

{
  undefined4 in_register_00000014;
  char16 *litbuf_00;
  char16 *litbuf_01;
  Inst *inst;
  DebugWriter *this_00;
  
  DebugWriter::Print(w,L"L%04x: ",CONCAT44(in_register_00000014,label));
  if (DAT_0145949d == '\x01') {
    DebugWriter::Print(w,L"(0x%03x bytes) ",0x2e);
  }
  DebugWriter::Print(w,L"ChompSetGroup<Plus>");
  DebugWriter::Print(w,L"(");
  SetMixin<false>::Print(&this->super_SetMixin<false>,w,litbuf);
  DebugWriter::Print(w,L", ");
  GroupMixin::Print(&this->super_GroupMixin,w,litbuf_00);
  DebugWriter::Print(w,L", ");
  NoNeedToSaveMixin::Print(&this->super_NoNeedToSaveMixin,w,litbuf_01);
  DebugWriter::PrintEOL(w,L")");
  if (DAT_0145949d == '\x01') {
    this_00 = w;
    DebugWriter::Indent(w);
    Inst::PrintBytes<UnifiedRegex::Inst>((Inst *)this_00,w,inst,&this->super_Inst,L"Inst");
    Inst::PrintBytes<UnifiedRegex::SetMixin<false>>
              (&this->super_Inst,w,&this->super_Inst,&this->super_SetMixin<false>,L"SetMixin<false>"
              );
    Inst::PrintBytes<UnifiedRegex::GroupMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_GroupMixin,L"GroupMixin");
    Inst::PrintBytes<UnifiedRegex::NoNeedToSaveMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_NoNeedToSaveMixin,
               L"NoNeedToSaveMixin");
    DebugWriter::Unindent(w);
  }
  return 0x2e;
}

Assistant:

int ChompSetGroupInst<Mode>::Print(DebugWriter* w, Label label, const Char* litbuf) const
    {
        if (Mode == ChompMode::Star)
        {
            PRINT_RE_BYTECODE_BEGIN("ChompSetGroup<Star>");
        }
        else
        {
            PRINT_RE_BYTECODE_BEGIN("ChompSetGroup<Plus>");
        }

        PRINT_MIXIN_COMMA(SetMixin<false>);
        PRINT_MIXIN_COMMA(GroupMixin);
        PRINT_MIXIN(NoNeedToSaveMixin);
        PRINT_RE_BYTECODE_MID();
        PRINT_BYTES(SetMixin<false>);
        PRINT_BYTES(GroupMixin);
        PRINT_BYTES(NoNeedToSaveMixin);
        PRINT_RE_BYTECODE_END();
    }